

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

TokenStream * __thiscall Catch::Clara::Detail::TokenStream::operator++(TokenStream *this)

{
  pointer __src;
  pointer *ppTVar1;
  pointer __dest;
  pointer pTVar2;
  StringRef *pSVar3;
  
  __dest = (this->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)(((long)pTVar2 - (long)__dest >> 3) * -0x5555555555555555) < 2) {
    pSVar3 = (this->it)._M_current;
    if (pSVar3 != (this->itEnd)._M_current) {
      (this->it)._M_current = pSVar3 + 1;
    }
    loadBuffer(this);
  }
  else {
    __src = __dest + 1;
    if (__src != pTVar2) {
      memmove(__dest,__src,(long)pTVar2 - (long)__src);
    }
    ppTVar1 = &(this->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + -1;
  }
  return this;
}

Assistant:

TokenStream& TokenStream::operator++() {
                if ( m_tokenBuffer.size() >= 2 ) {
                    m_tokenBuffer.erase( m_tokenBuffer.begin() );
                } else {
                    if ( it != itEnd )
                        ++it;
                    loadBuffer();
                }
                return *this;
            }